

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service_options.hxx
# Opt level: O0

void __thiscall
nuraft::asio_service_options::asio_service_options
          (asio_service_options *this,asio_service_options *param_2)

{
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  function<bool_(const_nuraft::asio_service_meta_cb_params_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_stack_ffffffffffffff88;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::error_code)>)>
  *__x;
  function<bool_(const_nuraft::asio_service_meta_cb_params_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_stack_ffffffffffffff90;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::error_code)>)>
  *this_00;
  
  *in_RDI = *in_RSI;
  std::function<void_(unsigned_int)>::function
            ((function<void_(unsigned_int)> *)in_stack_ffffffffffffff90,
             (function<void_(unsigned_int)> *)in_stack_ffffffffffffff88);
  std::function<void_(unsigned_int)>::function
            ((function<void_(unsigned_int)> *)in_stack_ffffffffffffff90,
             (function<void_(unsigned_int)> *)in_stack_ffffffffffffff88);
  *(undefined2 *)(in_RDI + 9) = *(undefined2 *)(in_RSI + 9);
  std::__cxx11::string::string((string *)(in_RDI + 10),(string *)(in_RSI + 10));
  std::__cxx11::string::string((string *)(in_RDI + 0xe),(string *)(in_RSI + 0xe));
  std::__cxx11::string::string((string *)(in_RDI + 0x12),(string *)(in_RSI + 0x12));
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_nuraft::asio_service_meta_cb_params_&)>
  ::function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_nuraft::asio_service_meta_cb_params_&)>
              *)in_stack_ffffffffffffff90,
             (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_nuraft::asio_service_meta_cb_params_&)>
              *)in_stack_ffffffffffffff88);
  std::
  function<bool_(const_nuraft::asio_service_meta_cb_params_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  *(byte *)(in_RDI + 0x1e) = *(byte *)(in_RSI + 0x1e) & 1;
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_nuraft::asio_service_meta_cb_params_&)>
  ::function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_nuraft::asio_service_meta_cb_params_&)>
              *)in_stack_ffffffffffffff90,
             (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_nuraft::asio_service_meta_cb_params_&)>
              *)in_stack_ffffffffffffff88);
  this_00 = (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::error_code)>)>
             *)(in_RDI + 0x23);
  std::
  function<bool_(const_nuraft::asio_service_meta_cb_params_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function((function<bool_(const_nuraft::asio_service_meta_cb_params_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)this_00,in_stack_ffffffffffffff88);
  *(byte *)(in_RDI + 0x27) = *(byte *)(in_RSI + 0x27) & 1;
  __x = (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::error_code)>)>
         *)(in_RDI + 0x28);
  std::
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)this_00,
             (function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)__x);
  std::function<ssl_ctx_st_*()>::function
            ((function<ssl_ctx_st_*()> *)this_00,(function<ssl_ctx_st_*()> *)__x);
  std::function<ssl_ctx_st_*()>::function
            ((function<ssl_ctx_st_*()> *)this_00,(function<ssl_ctx_st_*()> *)__x);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::error_code)>)>
  ::function(this_00,__x);
  *(byte *)(in_RDI + 0x38) = *(byte *)(in_RSI + 0x38) & 1;
  return;
}

Assistant:

asio_service_options()
        : thread_pool_size_(0)
        , worker_start_(nullptr)
        , worker_stop_(nullptr)
        , enable_ssl_(false)
        , skip_verification_(false)
        , write_req_meta_(nullptr)
        , read_req_meta_(nullptr)
        , invoke_req_cb_on_empty_meta_(true)
        , write_resp_meta_(nullptr)
        , read_resp_meta_(nullptr)
        , invoke_resp_cb_on_empty_meta_(true)
        , verify_sn_(nullptr)
        , custom_resolver_(nullptr)
        , replicate_log_timestamp_(false)
        {}